

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeRTASParallelOperationGetPropertiesExp
          (ze_rtas_parallel_operation_exp_handle_t hParallelOperation,
          ze_rtas_parallel_operation_exp_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010e148 != (code *)0x0) {
    zVar1 = (*DAT_0010e148)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationGetPropertiesExp(
        ze_rtas_parallel_operation_exp_handle_t hParallelOperation, ///< [in] handle of parallel operation object
        ze_rtas_parallel_operation_exp_properties_t* pProperties///< [in,out] query result for parallel operation properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetPropertiesExp = context.zeDdiTable.RTASParallelOperationExp.pfnGetPropertiesExp;
        if( nullptr != pfnGetPropertiesExp )
        {
            result = pfnGetPropertiesExp( hParallelOperation, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }